

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O0

void uavs3d_ipred_ang_xy_13_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i d_6;
  __m128i s_3;
  __m128i d_5;
  __m256i s_2;
  __m256i coeff_x_1;
  pel *py_1;
  pel *px_2;
  int c_2;
  int b_2;
  int a_2;
  int offsetx_2;
  int step1_width_1;
  int d_4;
  pel *py;
  pel *px_1;
  int c_1;
  int b_1;
  int a_1;
  int offsetx_1;
  int step1_width;
  int d_3;
  __m128i d_2;
  __m128i s_1;
  __m128i d_1;
  __m256i s;
  __m256i coeff_x;
  int c;
  int b;
  int a;
  int offsetx;
  pel *px;
  int d;
  __m128i c_64;
  __m256i shuffle_x;
  int step1_height;
  pel *psrc;
  int j;
  int i;
  int local_8bc;
  int local_8b4;
  int local_894;
  undefined4 local_890;
  undefined8 local_870;
  undefined1 auStack_850 [16];
  byte *local_820;
  byte *local_818;
  byte *local_7f8;
  byte *local_7f0;
  undefined4 local_7d0;
  undefined8 local_7b0;
  undefined1 auStack_790 [16];
  long local_740;
  int local_6d8;
  int local_6d4;
  long local_6c0;
  undefined1 local_410 [16];
  undefined1 local_3d0 [16];
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_894 = in_R9D;
  if (6 < in_R9D) {
    local_894 = 7;
  }
  auVar1 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar1 = vpinsrb_avx(auVar1,2,2);
  auVar1 = vpinsrb_avx(auVar1,3,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,2,5);
  auVar1 = vpinsrb_avx(auVar1,3,6);
  auVar1 = vpinsrb_avx(auVar1,4,7);
  auVar1 = vpinsrb_avx(auVar1,2,8);
  auVar1 = vpinsrb_avx(auVar1,3,9);
  auVar1 = vpinsrb_avx(auVar1,4,10);
  auVar1 = vpinsrb_avx(auVar1,5,0xb);
  auVar1 = vpinsrb_avx(auVar1,3,0xc);
  auVar1 = vpinsrb_avx(auVar1,4,0xd);
  auVar1 = vpinsrb_avx(auVar1,5,0xe);
  auVar1 = vpinsrb_avx(auVar1,6,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar2 = vpinsrb_avx(auVar2,2,2);
  auVar2 = vpinsrb_avx(auVar2,3,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,2,5);
  auVar2 = vpinsrb_avx(auVar2,3,6);
  auVar2 = vpinsrb_avx(auVar2,4,7);
  auVar2 = vpinsrb_avx(auVar2,2,8);
  auVar2 = vpinsrb_avx(auVar2,3,9);
  auVar2 = vpinsrb_avx(auVar2,4,10);
  auVar2 = vpinsrb_avx(auVar2,5,0xb);
  auVar2 = vpinsrb_avx(auVar2,3,0xc);
  auVar2 = vpinsrb_avx(auVar2,4,0xd);
  auVar2 = vpinsrb_avx(auVar2,5,0xe);
  auVar2 = vpinsrb_avx(auVar2,6,0xf);
  uStack_b0 = auVar2._0_8_;
  uStack_a8 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar2 = vpinsrw_avx(auVar2,0x40,7);
  local_6c0 = in_RSI;
  for (local_6d8 = 0; local_6d8 < local_894; local_6d8 = local_6d8 + 1) {
    local_740 = in_RDI - ((int)(local_6d8 + 1U) >> 3);
    uVar10 = (local_6d8 + 1U & 7) * -0x403fbfc + 0x20402000;
    auVar19 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
    auVar19 = vpinsrd_avx(auVar19,uVar10,2);
    auVar19 = vpinsrd_avx(auVar19,uVar10,3);
    auVar15 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
    auVar15 = vpinsrd_avx(auVar15,uVar10,2);
    auVar15 = vpinsrd_avx(auVar15,uVar10,3);
    auVar15 = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar15;
    auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
    uStack_130 = auVar19._0_8_;
    uStack_128 = auVar19._8_8_;
    for (local_6d4 = 0; local_6d4 + 4 < in_R8D; local_6d4 = local_6d4 + 8) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(local_740 + -1);
      auVar19 = vpunpcklqdq_avx(auVar19,ZEXT816(0));
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(local_740 + 3);
      auVar20 = vpunpcklqdq_avx(auVar20,ZEXT816(0));
      uStack_230 = auVar20._0_8_;
      uStack_228 = auVar20._8_8_;
      auVar6._16_8_ = uStack_230;
      auVar6._0_16_ = auVar19;
      auVar6._24_8_ = uStack_228;
      auVar3._16_8_ = uStack_b0;
      auVar3._0_16_ = auVar1;
      auVar3._24_8_ = uStack_a8;
      auVar3 = vpshufb_avx2(auVar6,auVar3);
      auVar8._16_8_ = uStack_130;
      auVar8._0_16_ = auVar15;
      auVar8._24_8_ = uStack_128;
      auVar3 = vpmaddubsw_avx2(auVar3,auVar8);
      auStack_790 = auVar3._16_16_;
      auVar19 = vphaddw_avx(auStack_790,local_3d0);
      auVar19 = vpaddw_avx(auVar19,auVar2);
      auVar19 = vpsrlw_avx(auVar19,ZEXT416(7));
      auVar19 = vpackuswb_avx(auVar19,auVar19);
      local_7b0 = auVar19._0_8_;
      *(undefined8 *)(local_6c0 + local_6d4) = local_7b0;
      local_740 = local_740 + 8;
    }
    if (local_6d4 < in_R8D) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(local_740 + -1);
      auVar19 = vpunpcklqdq_avx(auVar16,ZEXT816(0));
      auVar19 = vpshufb_avx(auVar19,auVar1);
      auVar19 = vpmaddubsw_avx(auVar19,auVar15);
      auVar19 = vphaddw_avx(auVar19,auVar19);
      auVar19 = vpaddw_avx(auVar19,auVar2);
      auVar19 = vpsrlw_avx(auVar19,ZEXT416(7));
      auVar19 = vpackuswb_avx(auVar19,auVar19);
      local_7d0 = auVar19._0_4_;
      *(undefined4 *)(local_6c0 + local_6d4) = local_7d0;
    }
    local_6c0 = local_6c0 + in_EDX;
  }
  if (in_R8D == 4) {
    for (; local_6d8 < in_R9D; local_6d8 = local_6d8 + 1) {
      local_8b4 = (int)((double)(local_6d8 + 1) / 8.0 + 0.9999) + -1;
      uVar10 = local_6d8 + 1U & 7;
      local_7f0 = (byte *)((in_RDI + local_8b4) - (long)((int)(local_6d8 + 1U) >> 3));
      if (3 < local_8b4) {
        local_8b4 = 4;
      }
      pbVar9 = (byte *)(in_RDI - local_6d8);
      for (local_6d4 = 0; local_7f8 = pbVar9 + 8, local_6d4 < local_8b4; local_6d4 = local_6d4 + 1)
      {
        *(char *)(local_6c0 + local_6d4) =
             (char)((int)((uint)pbVar9[6] + (uint)pbVar9[7] * 2 + (uint)*local_7f8 + 2) >> 2);
        pbVar9 = local_7f8;
      }
      for (; local_6d4 < 4; local_6d4 = local_6d4 + 1) {
        *(char *)(local_6c0 + local_6d4) =
             (char)((int)((uint)local_7f0[2] * (uVar10 * -4 + 0x20) +
                          (uint)local_7f0[1] * (uVar10 * -4 + 0x40) +
                          (uint)*local_7f0 * (uVar10 * 4 + 0x20) + (uint)local_7f0[-1] * uVar10 * 4
                         + 0x40) >> 7);
        local_7f0 = local_7f0 + 1;
      }
      local_6c0 = local_6c0 + in_EDX;
    }
  }
  else {
    for (; local_6d8 < in_R9D; local_6d8 = local_6d8 + 1) {
      iVar11 = (int)((double)(local_6d8 + 1) * 0.125 + 0.9999) + -1;
      uVar10 = local_6d8 + 1U & 7;
      iVar12 = uVar10 * 4;
      iVar13 = uVar10 * -4 + 0x20;
      iVar14 = uVar10 * -4 + 0x40;
      local_818 = (byte *)((in_RDI + iVar11) - (long)((int)(local_6d8 + 1U) >> 3));
      uVar10 = iVar12 + (iVar12 + 0x20) * 0x100 + iVar14 * 0x10000 + iVar13 * 0x1000000;
      auVar19 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
      auVar19 = vpinsrd_avx(auVar19,uVar10,2);
      auVar19 = vpinsrd_avx(auVar19,uVar10,3);
      auVar15 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
      auVar15 = vpinsrd_avx(auVar15,uVar10,2);
      auVar15 = vpinsrd_avx(auVar15,uVar10,3);
      auVar15 = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar15;
      auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
      uStack_f0 = auVar19._0_8_;
      uStack_e8 = auVar19._8_8_;
      local_8bc = in_R8D;
      if (iVar11 < in_R8D) {
        local_8bc = iVar11;
      }
      pbVar9 = (byte *)(in_RDI - local_6d8);
      for (local_6d4 = 0; local_820 = pbVar9 + 8, local_6d4 < local_8bc; local_6d4 = local_6d4 + 1)
      {
        *(char *)(local_6c0 + local_6d4) =
             (char)((int)((uint)pbVar9[6] + (uint)pbVar9[7] * 2 + (uint)*local_820 + 2) >> 2);
        pbVar9 = local_820;
      }
      for (local_6d4 = local_8bc; local_6d4 + 7 < in_R8D; local_6d4 = local_6d4 + 8) {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(local_818 + -1);
        auVar19 = vpunpcklqdq_avx(auVar17,ZEXT816(0));
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(local_818 + 3);
        auVar20 = vpunpcklqdq_avx(auVar21,ZEXT816(0));
        uStack_270 = auVar20._0_8_;
        uStack_268 = auVar20._8_8_;
        auVar5._16_8_ = uStack_270;
        auVar5._0_16_ = auVar19;
        auVar5._24_8_ = uStack_268;
        auVar4._16_8_ = uStack_b0;
        auVar4._0_16_ = auVar1;
        auVar4._24_8_ = uStack_a8;
        auVar3 = vpshufb_avx2(auVar5,auVar4);
        auVar7._16_8_ = uStack_f0;
        auVar7._0_16_ = auVar15;
        auVar7._24_8_ = uStack_e8;
        auVar3 = vpmaddubsw_avx2(auVar3,auVar7);
        auStack_850 = auVar3._16_16_;
        auVar19 = vphaddw_avx(auStack_850,local_410);
        auVar19 = vpaddw_avx(auVar19,auVar2);
        auVar19 = vpsrlw_avx(auVar19,ZEXT416(7));
        auVar19 = vpackuswb_avx(auVar19,auVar19);
        local_870 = auVar19._0_8_;
        *(undefined8 *)(local_6c0 + local_6d4) = local_870;
        local_818 = local_818 + 8;
      }
      if (local_6d4 + 3 < in_R8D) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(local_818 + -1);
        auVar19 = vpunpcklqdq_avx(auVar18,ZEXT816(0));
        auVar19 = vpshufb_avx(auVar19,auVar1);
        auVar19 = vpmaddubsw_avx(auVar19,auVar15);
        auVar19 = vphaddw_avx(auVar19,auVar19);
        auVar19 = vpaddw_avx(auVar19,auVar2);
        auVar19 = vpsrlw_avx(auVar19,ZEXT416(7));
        auVar19 = vpackuswb_avx(auVar19,auVar19);
        local_890 = auVar19._0_4_;
        *(undefined4 *)(local_6c0 + local_6d4) = local_890;
        local_6d4 = local_6d4 + 4;
        local_818 = local_818 + 4;
      }
      for (; local_6d4 < in_R8D; local_6d4 = local_6d4 + 1) {
        *(char *)(local_6c0 + local_6d4) =
             (char)((int)((uint)local_818[2] * iVar13 + (uint)local_818[1] * iVar14 +
                          (uint)*local_818 * (iVar12 + 0x20) + (uint)local_818[-1] * iVar12 + 0x40)
                   >> 7);
        local_818 = local_818 + 1;
      }
      local_6c0 = local_6c0 + in_EDX;
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_xy_13_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    pel *psrc = src;
    int step1_height = COM_MIN(height, 7);

    __m256i shuffle_x = _mm256_setr_epi8(0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6, 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6);
    __m128i c_64 = _mm_set1_epi16(64);

    for (j = 0; j < step1_height; j++) {
        int d = j + 1;
        pel *px = src - (d >> 3);
        int offsetx = (d << 2) & 0x1f;
        int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
        __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

        for (i = 0; i + 4 < width; i += 8, px += 8) {
            IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
        }
        if (i < width) {
            IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
        }
        dst += i_dst;
    }

    if (width == 4) {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
    else {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;
            __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }

            for (i = step1_width; i + 7 < width; i += 8, px += 8) {
                IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
            }
            if (i + 3 < width) {
                IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
                    i += 4;
                px += 4;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
}